

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

list_iterator<int> * __thiscall
nestl::impl::list_iterator<int>::operator++(list_iterator<int> *this)

{
  list_iterator<int> *this_local;
  
  if (this->m_node == (list_node_base *)0x0) {
    __assert_fail("m_node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0xf0,"list_iterator<T> &nestl::impl::list_iterator<int>::operator++() [T = int]")
    ;
  }
  if (this->m_node->m_prev == (list_node_base *)0x0) {
    __assert_fail("(m_node)->m_prev",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0xf0,"list_iterator<T> &nestl::impl::list_iterator<int>::operator++() [T = int]")
    ;
  }
  if (this->m_node->m_next == (list_node_base *)0x0) {
    __assert_fail("(m_node)->m_next",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0xf0,"list_iterator<T> &nestl::impl::list_iterator<int>::operator++() [T = int]")
    ;
  }
  if (this->m_node->m_prev->m_next != this->m_node) {
    __assert_fail("(m_node)->m_prev->m_next == (m_node)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0xf0,"list_iterator<T> &nestl::impl::list_iterator<int>::operator++() [T = int]")
    ;
  }
  if (this->m_node->m_next->m_prev != this->m_node) {
    __assert_fail("(m_node)->m_next->m_prev == (m_node)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0xf0,"list_iterator<T> &nestl::impl::list_iterator<int>::operator++() [T = int]")
    ;
  }
  this->m_node = this->m_node->m_next;
  if (this->m_node == (list_node_base *)0x0) {
    __assert_fail("m_node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0xf2,"list_iterator<T> &nestl::impl::list_iterator<int>::operator++() [T = int]")
    ;
  }
  if (this->m_node->m_prev == (list_node_base *)0x0) {
    __assert_fail("(m_node)->m_prev",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0xf2,"list_iterator<T> &nestl::impl::list_iterator<int>::operator++() [T = int]")
    ;
  }
  if (this->m_node->m_next != (list_node_base *)0x0) {
    if (this->m_node->m_prev->m_next != this->m_node) {
      __assert_fail("(m_node)->m_prev->m_next == (m_node)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                    ,0xf2,
                    "list_iterator<T> &nestl::impl::list_iterator<int>::operator++() [T = int]");
    }
    if (this->m_node->m_next->m_prev == this->m_node) {
      return this;
    }
    __assert_fail("(m_node)->m_next->m_prev == (m_node)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0xf2,"list_iterator<T> &nestl::impl::list_iterator<int>::operator++() [T = int]")
    ;
  }
  __assert_fail("(m_node)->m_next",
                "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                ,0xf2,"list_iterator<T> &nestl::impl::list_iterator<int>::operator++() [T = int]");
}

Assistant:

list_iterator& operator++() NESTL_NOEXCEPT_SPEC
    {
        NESTL_CHECK_LIST_NODE(m_node);
        m_node = m_node->m_next;
        NESTL_CHECK_LIST_NODE(m_node);

        return *this;
    }